

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

void pnga_update1_ghosts(Integer g_a)

{
  long lVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  C_Integer *pCVar8;
  byte bVar9;
  global_array_t *pgVar10;
  int _d;
  int iVar11;
  Integer proc;
  logical lVar12;
  long lVar13;
  long lVar14;
  size_t sVar15;
  Integer IVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int _ndim;
  ulong uVar29;
  long lVar30;
  Integer _last;
  int _index [7];
  Integer np;
  Integer _hi [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer slo_rem [7];
  int count [7];
  Integer plo_rem [7];
  char err_string [256];
  Integer dims [7];
  Integer thi_rem [7];
  Integer hi_rem [7];
  Integer lo_rem [7];
  Integer shi_rem [7];
  Integer tlo_rem [7];
  Integer width [7];
  Integer phi_rem [7];
  Integer hi_loc [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer plo_loc [7];
  Integer lo_loc [7];
  Integer increment [7];
  int local_6a8 [10];
  long local_680;
  long local_678;
  long local_670;
  long local_668;
  uint local_65c;
  Integer *local_658;
  long local_650;
  long local_648 [8];
  long local_608;
  long local_600;
  long local_5f8;
  long local_5f0;
  long local_5e8;
  Integer *local_5e0;
  ulong local_5d8;
  ulong local_5d0;
  long local_5c8;
  char **local_5c0;
  long local_5b8;
  long local_5b0;
  int local_5a8;
  int local_5a4;
  long local_5a0;
  long local_598;
  Integer local_590;
  int local_588 [8];
  int local_568 [8];
  Integer local_548 [8];
  int local_508 [8];
  long alStack_4e8 [8];
  long local_4a8;
  undefined7 uStack_4a0;
  undefined1 uStack_499;
  undefined7 uStack_498;
  ulong auStack_3a8 [8];
  Integer local_368 [8];
  ulong auStack_328 [8];
  long alStack_2e8 [8];
  ulong local_2a8 [8];
  Integer local_268 [8];
  ulong auStack_228 [8];
  long alStack_1e8 [8];
  ulong local_1a8 [8];
  long local_168 [8];
  long local_128 [7];
  long alStack_f0 [9];
  Integer local_a8 [8];
  long alStack_68 [7];
  
  proc = pnga_nodeid();
  lVar12 = pnga_has_ghosts(g_a);
  if (lVar12 != 0) {
    local_5e0 = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (local_5e0 == (Integer *)0x0) {
      pnga_error("pnga_update1_ghosts:malloc failed (_ga_map)",0);
    }
    lVar1 = g_a + 1000;
    local_658 = (Integer *)malloc(GAnproc << 3);
    if (local_658 == (Integer *)0x0) {
      pnga_error("pnga_update1_ghosts:malloc failed (_ga_proclist)",0);
    }
    iVar4 = GA[lVar1].elemsize;
    sVar2 = GA[lVar1].ndim;
    lVar30 = (long)sVar2;
    local_5a8 = GA[lVar1].corner_flag;
    local_5b0 = (long)GA[lVar1].p_handle;
    pnga_distribution(g_a,proc,local_a8,(Integer *)local_1a8);
    if (lVar30 < 1) {
      bVar9 = 1;
    }
    else {
      bVar9 = 1;
      lVar27 = 0;
      do {
        alStack_68[lVar27] = 0;
        auStack_228[lVar27] = GA[g_a + 1000].width[lVar27];
        auStack_3a8[lVar27] = GA[g_a + 1000].dims[lVar27];
        if ((local_a8[lVar27] == 0) && (local_1a8[lVar27] == 0xffffffffffffffff)) {
          bVar9 = 0;
        }
        lVar27 = lVar27 + 1;
      } while (lVar30 != lVar27);
    }
    if (0 < sVar2) {
      local_600 = (long)(int)proc;
      local_5a0 = lVar30 + -1;
      local_5a4 = sVar2 + -1;
      local_598 = 1;
      if (1 < local_5a0) {
        local_598 = local_5a0;
      }
      local_680 = g_a * 0x368;
      local_670 = local_680 + 0xd50a8;
      local_608 = local_680 + 0xd5068;
      local_678 = local_680 + 0xd4ee0;
      local_5f8 = local_680 + 0xd4f00;
      lVar19 = 0;
      lVar27 = 0;
      local_590 = g_a;
      do {
        local_5d8 = auStack_228[lVar19];
        if ((bool)(local_5d8 != 0 & bVar9)) {
          lVar13 = 0;
          do {
            lVar14 = local_a8[lVar13];
            if (lVar19 == lVar13) {
              auStack_328[lVar13] = lVar14 - 1;
              lVar27 = 1;
              alStack_2e8[lVar13] = lVar14 - local_5d8;
              if (lVar14 - local_5d8 == 0 || lVar14 < (long)local_5d8) {
                lVar27 = (ulong)(1 < lVar14) + 1;
              }
            }
            else {
              alStack_2e8[lVar13] = lVar14;
              auStack_328[lVar13] = local_1a8[lVar13];
            }
            lVar13 = lVar13 + 1;
          } while (lVar30 != lVar13);
          local_5f0 = lVar19;
          if (0 < lVar27) {
            lVar13 = 0;
            do {
              lVar14 = 0;
              do {
                if (lVar19 == lVar14 && lVar27 == 2) {
                  if (lVar13 == 0) {
                    local_548[lVar14] = 1;
                    goto LAB_0018706e;
                  }
                  uVar21 = auStack_3a8[lVar14];
                  lVar23 = alStack_2e8[lVar14] + uVar21;
LAB_00187089:
                  local_548[lVar14] = lVar23;
                }
                else {
                  if ((lVar19 == lVar14) && (alStack_2e8[lVar14] < 1)) {
                    uVar21 = auStack_3a8[lVar14];
                    lVar23 = (uVar21 - local_5d8) + 1;
                    goto LAB_00187089;
                  }
                  local_548[lVar14] = alStack_2e8[lVar14];
LAB_0018706e:
                  uVar21 = auStack_328[lVar14];
                }
                local_2a8[lVar14] = uVar21;
                lVar14 = lVar14 + 1;
              } while (lVar30 != lVar14);
              local_5e8 = lVar13;
              lVar12 = pnga_locate_region(g_a,local_548,(Integer *)local_2a8,local_5e0,local_658,
                                          &local_668);
              local_650 = lVar27;
              if (lVar12 == 0) {
                local_4a8._0_1_ = 'c';
                local_4a8._1_1_ = 'a';
                local_4a8._2_1_ = 'n';
                local_4a8._3_1_ = 'n';
                local_4a8._4_1_ = 'o';
                local_4a8._5_1_ = 't';
                local_4a8._6_1_ = ' ';
                local_4a8._7_1_ = 'l';
                uStack_4a0 = 0x7220657461636f;
                uStack_499 = 0x65;
                uStack_498 = 0x203a6e6f6967;
                strcpy((char *)((long)&uStack_498 + 6),GA[lVar1].name);
                sVar15 = strlen((char *)&local_4a8);
                sprintf((char *)((long)&local_4a8 + (long)(int)sVar15)," [%ld:%ld ",local_548[0]);
                sVar15 = strlen((char *)&local_4a8);
                iVar22 = (int)sVar15;
                IVar16 = pnga_ndim(g_a);
                if (1 < IVar16) {
                  lVar27 = 1;
                  do {
                    sprintf((char *)((long)&local_4a8 + (long)(int)sVar15),",%ld:%ld ",
                            local_548[lVar27]);
                    sVar15 = strlen((char *)&local_4a8);
                    iVar22 = (int)sVar15;
                    lVar27 = lVar27 + 1;
                    IVar16 = pnga_ndim(g_a);
                  } while (lVar27 < IVar16);
                }
                *(undefined2 *)((long)&local_4a8 + (long)iVar22) = 0x5d;
                pnga_error((char *)&local_4a8,g_a);
                lVar19 = local_5f0;
              }
              lVar27 = local_650;
              if (0 < local_668) {
                lVar13 = 0;
                do {
                  uVar21 = local_658[lVar13];
                  local_5b8 = lVar13;
                  pnga_distribution(g_a,uVar21,local_268,local_368);
                  lVar13 = local_670;
                  pgVar10 = GA;
                  lVar14 = 0;
                  do {
                    if (alStack_68[lVar14] == 0) {
                      if (lVar19 == lVar14) {
                        if (local_668 == 1 && lVar27 == 1) {
                          alStack_4e8[lVar14] = (local_368[lVar14] - local_268[lVar14]) + 1;
                          lVar23 = (local_368[lVar14] - local_268[lVar14]) + auStack_228[lVar14];
                          goto LAB_00187284;
                        }
                        lVar23 = local_268[lVar14];
                        if (lVar23 < local_548[lVar14]) {
                          lVar28 = 0;
                          lVar25 = local_548[lVar14];
                        }
                        else {
                          lVar28 = lVar23 - alStack_2e8[lVar14];
                          lVar25 = lVar23;
                        }
                        if (lVar28 < 0) {
                          lVar28 = lVar28 + auStack_3a8[lVar14];
                        }
                        uVar29 = 0;
                        if ((long)auStack_3a8[lVar14] <= lVar28) {
                          uVar29 = auStack_3a8[lVar14];
                        }
                        uVar29 = lVar28 - uVar29;
                        lVar23 = (local_368[lVar14] - lVar23) + auStack_228[lVar14];
                        alStack_4e8[lVar14] = (lVar25 - local_368[lVar14]) + lVar23;
                      }
                      else {
                        uVar29 = auStack_228[lVar14];
                        alStack_4e8[lVar14] = uVar29;
                        lVar23 = (local_368[lVar14] + uVar29) - local_268[lVar14];
                      }
                    }
                    else {
                      alStack_4e8[lVar14] = 0;
                      lVar23 = (alStack_68[lVar14] + local_368[lVar14]) - local_268[lVar14];
LAB_00187284:
                      uVar29 = 0;
                    }
                    alStack_1e8[lVar14] = lVar23;
                    alStack_f0[lVar14 + 1] = uVar29;
                    lVar14 = lVar14 + 1;
                  } while (lVar30 != lVar14);
                  uVar3 = GA[lVar1].ndim;
                  uVar29 = (ulong)(short)uVar3;
                  uVar5 = GA[lVar1].distr_type;
                  local_65c = uVar5 - 1;
                  local_5d0 = (ulong)uVar5;
                  if (uVar5 - 1 < 3) {
                    uVar24 = local_600 % GA[lVar1].num_blocks[0];
                    local_6a8[0] = (int)uVar24;
                    if (1 < (short)uVar3) {
                      uVar24 = uVar24 & 0xffffffff;
                      lVar27 = 0;
                      IVar16 = proc;
                      do {
                        IVar16 = (long)((int)IVar16 - (int)uVar24) /
                                 *(long *)((long)GA->dims + lVar27 * 8 + lVar13 + -0x38);
                        uVar24 = (long)(int)IVar16 %
                                 *(long *)((long)GA->dims + lVar27 * 8 + lVar13 + -0x30);
                        local_6a8[lVar27 + 1] = (int)uVar24;
                        lVar27 = lVar27 + 1;
                      } while ((uVar29 & 0xffffffff) - 1 != lVar27);
                    }
                    lVar27 = local_608;
                    if (0 < (short)uVar3) {
                      lVar19 = 0;
                      do {
                        iVar22 = *(int *)((long)local_6a8 + lVar19);
                        lVar13 = *(long *)((long)GA->dims + lVar19 * 2 + lVar27 + -0x30);
                        *(long *)((long)&local_4a8 + lVar19 * 2) = lVar13 * iVar22 + 1;
                        lVar13 = ((long)iVar22 + 1) * lVar13;
                        *(long *)((long)local_648 + lVar19 * 2) = lVar13;
                        lVar14 = *(long *)((long)GA + lVar19 * 2 + lVar27 + -0x1f8);
                        if (lVar14 <= lVar13) {
                          lVar13 = lVar14;
                        }
                        *(long *)((long)local_648 + lVar19 * 2) = lVar13;
                        lVar19 = lVar19 + 4;
                      } while ((uVar29 & 0xffffffff) << 2 != lVar19);
                    }
                  }
                  else if (uVar5 == 4) {
                    uVar24 = local_600 % GA[lVar1].num_blocks[0];
                    local_6a8[0] = (int)uVar24;
                    if (1 < (short)uVar3) {
                      uVar24 = uVar24 & 0xffffffff;
                      lVar27 = 0;
                      IVar16 = proc;
                      do {
                        IVar16 = (long)((int)IVar16 - (int)uVar24) /
                                 *(long *)((long)GA->dims + lVar27 * 8 + lVar13 + -0x38);
                        uVar24 = (long)(int)IVar16 %
                                 *(long *)((long)GA->dims + lVar27 * 8 + lVar13 + -0x30);
                        local_6a8[lVar27 + 1] = (int)uVar24;
                        lVar27 = lVar27 + 1;
                      } while ((uVar29 & 0xffffffff) - 1 != lVar27);
                    }
                    if (0 < (short)uVar3) {
                      pCVar8 = GA[lVar1].mapc;
                      lVar27 = 0;
                      iVar22 = 0;
                      do {
                        iVar11 = *(int *)((long)local_6a8 + lVar27);
                        lVar19 = (long)iVar22 + (long)iVar11;
                        *(C_Integer *)((long)&local_4a8 + lVar27 * 2) = pCVar8[lVar19];
                        if ((long)iVar11 < *(long *)((long)GA[lVar1].num_blocks + lVar27 * 2) + -1)
                        {
                          lVar19 = GA[lVar1].mapc[lVar19 + 1] + -1;
                        }
                        else {
                          lVar19 = *(long *)((long)GA[lVar1].dims + lVar27 * 2);
                        }
                        *(long *)((long)local_648 + lVar27 * 2) = lVar19;
                        iVar22 = iVar22 + *(int *)((long)GA[lVar1].num_blocks + lVar27 * 2);
                        lVar27 = lVar27 + 4;
                      } while ((uVar29 & 0xffffffff) << 2 != lVar27);
                    }
                  }
                  else if (uVar5 == 0) {
                    if (GA[lVar1].num_rstrctd == 0) {
                      if ((short)uVar3 < 1) {
                        lVar27 = 1;
                      }
                      else {
                        lVar27 = 1;
                        uVar24 = 0;
                        do {
                          lVar27 = lVar27 * *(int *)((long)GA->dims + uVar24 * 4 + local_678 + -0x30
                                                    );
                          uVar24 = uVar24 + 1;
                        } while (uVar29 != uVar24);
                      }
                      if ((-1 < proc) && (proc < lVar27)) {
                        if (0 < (short)uVar3) {
                          pCVar8 = GA[lVar1].mapc;
                          uVar24 = 0;
                          lVar27 = 0;
                          IVar16 = proc;
                          do {
                            lVar13 = (long)*(int *)((long)GA[1000].nblock + uVar24 * 4 + local_680);
                            lVar19 = IVar16 % lVar13;
                            (&local_4a8)[uVar24] = pCVar8[lVar19 + lVar27];
                            if (lVar19 == lVar13 + -1) {
                              lVar19 = *(long *)((long)GA[1000].dims + uVar24 * 8 + local_680);
                            }
                            else {
                              lVar19 = pCVar8[lVar19 + lVar27 + 1] + -1;
                            }
                            lVar27 = lVar27 + lVar13;
                            local_648[uVar24] = lVar19;
                            uVar24 = uVar24 + 1;
                            IVar16 = IVar16 / lVar13;
                          } while (uVar29 != uVar24);
                        }
                        goto LAB_00187703;
                      }
                    }
                    else if (proc < GA[lVar1].num_rstrctd) {
                      if ((short)uVar3 < 1) {
                        lVar27 = 1;
                      }
                      else {
                        lVar27 = 1;
                        uVar24 = 0;
                        do {
                          lVar27 = lVar27 * *(int *)((long)GA->dims + uVar24 * 4 + local_678 + -0x30
                                                    );
                          uVar24 = uVar24 + 1;
                        } while (uVar29 != uVar24);
                      }
                      if ((-1 < proc) && (proc < lVar27)) {
                        if (0 < (short)uVar3) {
                          pCVar8 = GA[lVar1].mapc;
                          uVar24 = 0;
                          lVar27 = 0;
                          IVar16 = proc;
                          do {
                            lVar13 = (long)*(int *)((long)GA[1000].nblock + uVar24 * 4 + local_680);
                            lVar19 = IVar16 % lVar13;
                            (&local_4a8)[uVar24] = pCVar8[lVar19 + lVar27];
                            if (lVar19 == lVar13 + -1) {
                              lVar19 = *(long *)((long)GA[1000].dims + uVar24 * 8 + local_680);
                            }
                            else {
                              lVar19 = pCVar8[lVar19 + lVar27 + 1] + -1;
                            }
                            lVar27 = lVar27 + lVar13;
                            local_648[uVar24] = lVar19;
                            uVar24 = uVar24 + 1;
                            IVar16 = IVar16 / lVar13;
                          } while (uVar29 != uVar24);
                        }
                        goto LAB_00187703;
                      }
                    }
                    if (0 < (short)uVar3) {
                      memset(&local_4a8,0,uVar29 * 8);
                      memset(local_648,0xff,uVar29 * 8);
                    }
                  }
LAB_00187703:
                  lVar27 = local_670;
                  if (uVar29 == 1) {
                    local_128[0] = (local_648[0] - local_4a8) + pgVar10[lVar1].width[0] * 2 + 1;
                  }
                  if ((short)uVar3 < 2) {
                    lVar14 = 1;
                    lVar13 = 0;
                  }
                  else {
                    lVar14 = 1;
                    lVar19 = 0;
                    lVar13 = 0;
                    do {
                      lVar13 = lVar13 + alStack_f0[lVar19 + 1] * lVar14;
                      lVar23 = (local_648[lVar19] - (&local_4a8)[lVar19]) +
                               *(long *)((long)pgVar10->dims + lVar19 * 8 + local_5f8 + -0x30) * 2 +
                               1;
                      local_128[lVar19] = lVar23;
                      lVar14 = lVar14 * lVar23;
                      lVar19 = lVar19 + 1;
                    } while (uVar29 - 1 != lVar19);
                  }
                  lVar23 = alStack_f0[uVar29];
                  iVar22 = pgVar10[lVar1].elemsize;
                  local_5c8 = (long)iVar22;
                  local_5c0 = pgVar10[lVar1].ptr;
                  pcVar6 = pgVar10[lVar1].ptr[proc];
                  if (local_65c < 3) {
                    uVar24 = (long)(int)uVar21 % pgVar10[lVar1].num_blocks[0];
                    local_6a8[0] = (int)uVar24;
                    if (1 < (short)uVar3) {
                      uVar24 = uVar24 & 0xffffffff;
                      lVar19 = 0;
                      uVar17 = uVar21;
                      do {
                        uVar17 = (long)((int)uVar17 - (int)uVar24) /
                                 *(long *)((long)pgVar10->dims + lVar19 * 8 + lVar27 + -0x38);
                        uVar24 = (long)(int)uVar17 %
                                 *(long *)((long)pgVar10->dims + lVar19 * 8 + lVar27 + -0x30);
                        local_6a8[lVar19 + 1] = (int)uVar24;
                        lVar19 = lVar19 + 1;
                      } while ((uVar29 & 0xffffffff) - 1 != lVar19);
                    }
                    lVar27 = local_608;
                    if (0 < (short)uVar3) {
                      lVar19 = 0;
                      do {
                        iVar11 = *(int *)((long)local_6a8 + lVar19);
                        lVar25 = *(long *)((long)pgVar10->dims + lVar19 * 2 + lVar27 + -0x30);
                        *(long *)((long)&local_4a8 + lVar19 * 2) = lVar25 * iVar11 + 1;
                        lVar25 = ((long)iVar11 + 1) * lVar25;
                        *(long *)((long)local_648 + lVar19 * 2) = lVar25;
                        lVar28 = *(long *)((long)pgVar10 + lVar19 * 2 + lVar27 + -0x1f8);
                        if (lVar28 <= lVar25) {
                          lVar25 = lVar28;
                        }
                        *(long *)((long)local_648 + lVar19 * 2) = lVar25;
                        lVar19 = lVar19 + 4;
                      } while ((uVar29 & 0xffffffff) << 2 != lVar19);
                    }
                  }
                  else if ((int)local_5d0 == 4) {
                    uVar24 = (long)(int)uVar21 % pgVar10[lVar1].num_blocks[0];
                    local_6a8[0] = (int)uVar24;
                    if (1 < (short)uVar3) {
                      uVar24 = uVar24 & 0xffffffff;
                      lVar19 = 0;
                      uVar17 = uVar21;
                      do {
                        uVar17 = (long)((int)uVar17 - (int)uVar24) /
                                 *(long *)((long)pgVar10->dims + lVar19 * 8 + lVar27 + -0x38);
                        uVar24 = (long)(int)uVar17 %
                                 *(long *)((long)pgVar10->dims + lVar19 * 8 + lVar27 + -0x30);
                        local_6a8[lVar19 + 1] = (int)uVar24;
                        lVar19 = lVar19 + 1;
                      } while ((uVar29 & 0xffffffff) - 1 != lVar19);
                    }
                    if (0 < (short)uVar3) {
                      pCVar8 = pgVar10[lVar1].mapc;
                      lVar27 = 0;
                      iVar11 = 0;
                      do {
                        iVar18 = *(int *)((long)local_6a8 + lVar27);
                        lVar19 = (long)iVar11 + (long)iVar18;
                        *(C_Integer *)((long)&local_4a8 + lVar27 * 2) = pCVar8[lVar19];
                        if ((long)iVar18 <
                            *(long *)((long)pgVar10[lVar1].num_blocks + lVar27 * 2) + -1) {
                          lVar19 = pgVar10[lVar1].mapc[lVar19 + 1] + -1;
                        }
                        else {
                          lVar19 = *(long *)((long)pgVar10[lVar1].dims + lVar27 * 2);
                        }
                        *(long *)((long)local_648 + lVar27 * 2) = lVar19;
                        iVar11 = iVar11 + *(int *)((long)pgVar10[lVar1].num_blocks + lVar27 * 2);
                        lVar27 = lVar27 + 4;
                      } while ((uVar29 & 0xffffffff) << 2 != lVar27);
                    }
                  }
                  else if ((int)local_5d0 == 0) {
                    if (pgVar10[lVar1].num_rstrctd == 0) {
                      if ((short)uVar3 < 1) {
                        lVar27 = 1;
                      }
                      else {
                        lVar27 = 1;
                        uVar24 = 0;
                        do {
                          lVar27 = lVar27 * *(int *)((long)pgVar10->dims +
                                                    uVar24 * 4 + local_678 + -0x30);
                          uVar24 = uVar24 + 1;
                        } while (uVar29 != uVar24);
                      }
                      if (((long)uVar21 < 0) || (lVar27 <= (long)uVar21)) {
LAB_00187b44:
                        if (0 < (short)uVar3) {
                          memset(&local_4a8,0,uVar29 << 3);
LAB_00187b73:
                          memset(local_648,0xff,uVar29 << 3);
                        }
                      }
                      else if (0 < (short)uVar3) {
                        pCVar8 = pgVar10[lVar1].mapc;
                        lVar27 = 0;
                        uVar17 = 0;
                        uVar24 = uVar21;
                        do {
                          lVar25 = (long)*(int *)((long)pgVar10[1000].nblock +
                                                 uVar17 * 4 + local_680);
                          lVar19 = (long)uVar24 % lVar25;
                          (&local_4a8)[uVar17] = pCVar8[lVar19 + lVar27];
                          if (lVar19 == lVar25 + -1) {
                            lVar19 = *(long *)((long)pgVar10[1000].dims + uVar17 * 8 + local_680);
                          }
                          else {
                            lVar19 = pCVar8[lVar19 + lVar27 + 1] + -1;
                          }
                          lVar27 = lVar27 + lVar25;
                          local_648[uVar17] = lVar19;
                          uVar17 = uVar17 + 1;
                          uVar24 = (long)uVar24 / lVar25;
                        } while (uVar29 != uVar17);
                      }
                    }
                    else if ((long)uVar21 < pgVar10[lVar1].num_rstrctd) {
                      if ((short)uVar3 < 1) {
                        lVar27 = 1;
                      }
                      else {
                        lVar27 = 1;
                        uVar24 = 0;
                        do {
                          lVar27 = lVar27 * *(int *)((long)pgVar10->dims +
                                                    uVar24 * 4 + local_678 + -0x30);
                          uVar24 = uVar24 + 1;
                        } while (uVar29 != uVar24);
                      }
                      if (((long)uVar21 < 0) || (lVar27 <= (long)uVar21)) goto LAB_00187b44;
                      if (0 < (short)uVar3) {
                        pCVar8 = pgVar10[lVar1].mapc;
                        lVar27 = 0;
                        uVar17 = 0;
                        uVar24 = uVar21;
                        do {
                          lVar25 = (long)*(int *)((long)pgVar10[1000].nblock +
                                                 uVar17 * 4 + local_680);
                          lVar19 = (long)uVar24 % lVar25;
                          (&local_4a8)[uVar17] = pCVar8[lVar19 + lVar27];
                          if (lVar19 == lVar25 + -1) {
                            lVar19 = *(long *)((long)pgVar10[1000].dims + uVar17 * 8 + local_680);
                          }
                          else {
                            lVar19 = pCVar8[lVar19 + lVar27 + 1] + -1;
                          }
                          lVar27 = lVar27 + lVar25;
                          local_648[uVar17] = lVar19;
                          uVar17 = uVar17 + 1;
                          uVar24 = (long)uVar24 / lVar25;
                        } while (uVar29 != uVar17);
                      }
                    }
                    else if (0 < (short)uVar3) {
                      memset(&local_4a8,0,(ulong)uVar3 << 3);
                      goto LAB_00187b73;
                    }
                  }
                  g_a = local_590;
                  lVar19 = local_5f0;
                  lVar27 = local_650;
                  if (uVar29 == 1) {
                    local_168[0] = (local_648[0] - local_4a8) + pgVar10[lVar1].width[0] * 2 + 1;
                  }
                  if ((short)uVar3 < 2) {
                    lVar28 = 1;
                    lVar25 = 0;
                  }
                  else {
                    lVar28 = 1;
                    lVar20 = 0;
                    lVar25 = 0;
                    do {
                      lVar25 = lVar25 + alStack_4e8[lVar20] * lVar28;
                      lVar26 = (local_648[lVar20] - (&local_4a8)[lVar20]) +
                               *(long *)((long)pgVar10->dims + lVar20 * 8 + local_5f8 + -0x30) * 2 +
                               1;
                      local_168[lVar20] = lVar26;
                      lVar28 = lVar28 * lVar26;
                      lVar20 = lVar20 + 1;
                    } while (uVar29 - 1 != lVar20);
                  }
                  lVar20 = alStack_4e8[uVar29 - 1];
                  pcVar7 = local_5c0[uVar21];
                  local_568[0] = iVar4;
                  local_588[0] = iVar4;
                  if (sVar2 != 1) {
                    lVar26 = 0;
                    iVar11 = iVar4;
                    iVar18 = iVar4;
                    do {
                      iVar18 = iVar18 * (int)local_168[lVar26];
                      local_588[lVar26] = iVar18;
                      iVar11 = iVar11 * (int)local_128[lVar26];
                      local_568[lVar26] = iVar11;
                      local_588[lVar26 + 1] = iVar18;
                      local_568[lVar26 + 1] = iVar11;
                      lVar26 = lVar26 + 1;
                    } while (local_598 != lVar26);
                  }
                  lVar26 = 0;
                  do {
                    local_508[lVar26] = ((int)alStack_1e8[lVar26] - (int)alStack_4e8[lVar26]) + 1;
                    lVar26 = lVar26 + 1;
                  } while (lVar30 != lVar26);
                  local_508[0] = local_508[0] * iVar4;
                  if (-1 < (int)local_5b0) {
                    uVar21 = (ulong)(uint)PGRP_LIST[local_5b0].inv_map_proc_list[uVar21];
                  }
                  ARMCI_GetS(pcVar7 + (lVar28 * lVar20 + lVar25) * local_5c8,local_588,
                             pcVar6 + (lVar14 * lVar23 + lVar13) * (long)iVar22,local_568,local_508,
                             (int)local_5a0,(int)uVar21);
                  lVar13 = local_5b8 + 1;
                } while (lVar13 < local_668);
              }
              lVar13 = local_5e8 + 1;
            } while (lVar13 != lVar27);
          }
          lVar13 = 0;
          do {
            if (lVar19 == lVar13) {
              uVar21 = local_1a8[lVar13];
              alStack_2e8[lVar13] = uVar21 + 1;
              auStack_328[lVar13] = uVar21 + local_5d8;
              lVar27 = 1;
              if ((long)auStack_3a8[lVar13] < (long)(uVar21 + local_5d8)) {
                lVar27 = (ulong)((long)uVar21 < (long)auStack_3a8[lVar13]) + 1;
              }
            }
            else {
              alStack_2e8[lVar13] = local_a8[lVar13];
              auStack_328[lVar13] = local_1a8[lVar13];
            }
            lVar13 = lVar13 + 1;
          } while (lVar30 != lVar13);
          if (0 < lVar27) {
            lVar13 = 0;
            do {
              lVar14 = 0;
              do {
                if (lVar19 == lVar14 && lVar27 == 2) {
                  if (lVar13 == 0) {
                    local_548[lVar14] = alStack_2e8[lVar14];
                    uVar21 = auStack_3a8[lVar14];
                  }
                  else {
                    local_548[lVar14] = 1;
                    uVar21 = auStack_328[lVar14] - auStack_3a8[lVar14];
                  }
                }
                else if (lVar19 == lVar14) {
                  uVar21 = auStack_328[lVar14];
                  if ((long)auStack_3a8[lVar14] < (long)uVar21) {
                    local_548[lVar14] = 1;
                    uVar21 = local_5d8;
                  }
                  else {
                    local_548[lVar14] = alStack_2e8[lVar14];
                  }
                }
                else {
                  local_548[lVar14] = alStack_2e8[lVar14];
                  uVar21 = auStack_328[lVar14];
                }
                local_2a8[lVar14] = uVar21;
                lVar14 = lVar14 + 1;
              } while (lVar30 != lVar14);
              local_5e8 = lVar13;
              lVar12 = pnga_locate_region(g_a,local_548,(Integer *)local_2a8,local_5e0,local_658,
                                          &local_668);
              local_650 = lVar27;
              if (lVar12 == 0) {
                local_4a8._0_1_ = 'c';
                local_4a8._1_1_ = 'a';
                local_4a8._2_1_ = 'n';
                local_4a8._3_1_ = 'n';
                local_4a8._4_1_ = 'o';
                local_4a8._5_1_ = 't';
                local_4a8._6_1_ = ' ';
                local_4a8._7_1_ = 'l';
                uStack_4a0 = 0x7220657461636f;
                uStack_499 = 0x65;
                uStack_498 = 0x203a6e6f6967;
                strcpy((char *)((long)&uStack_498 + 6),GA[lVar1].name);
                sVar15 = strlen((char *)&local_4a8);
                sprintf((char *)((long)&local_4a8 + (long)(int)sVar15)," [%ld:%ld ",local_548[0]);
                sVar15 = strlen((char *)&local_4a8);
                iVar22 = (int)sVar15;
                IVar16 = pnga_ndim(g_a);
                if (1 < IVar16) {
                  lVar27 = 1;
                  do {
                    sprintf((char *)((long)&local_4a8 + (long)(int)sVar15),",%ld:%ld ",
                            local_548[lVar27]);
                    sVar15 = strlen((char *)&local_4a8);
                    iVar22 = (int)sVar15;
                    lVar27 = lVar27 + 1;
                    IVar16 = pnga_ndim(g_a);
                  } while (lVar27 < IVar16);
                }
                *(undefined2 *)((long)&local_4a8 + (long)iVar22) = 0x5d;
                pnga_error((char *)&local_4a8,g_a);
                lVar19 = local_5f0;
              }
              lVar27 = local_650;
              if (0 < local_668) {
                lVar13 = 0;
                do {
                  uVar21 = local_658[lVar13];
                  local_5b8 = lVar13;
                  pnga_distribution(g_a,uVar21,local_268,local_368);
                  lVar13 = local_670;
                  pgVar10 = GA;
                  lVar14 = 0;
                  do {
                    if (alStack_68[lVar14] == 0) {
                      if (lVar19 == lVar14) {
                        if (local_668 == 1 && lVar27 == 1) {
                          uVar29 = auStack_228[lVar14];
                          alStack_4e8[lVar14] = uVar29;
                          alStack_1e8[lVar14] = uVar29 * 2 + -1;
                          lVar23 = (uVar29 + local_1a8[lVar14]) - local_a8[lVar14];
                        }
                        else {
                          uVar29 = local_2a8[lVar14];
                          if (local_368[lVar14] < (long)local_2a8[lVar14]) {
                            uVar29 = local_368[lVar14];
                          }
                          lVar23 = ~local_1a8[lVar14] + local_268[lVar14];
                          if (lVar23 < 0) {
                            lVar23 = lVar23 + auStack_3a8[lVar14];
                          }
                          uVar24 = auStack_3a8[lVar14];
                          if (lVar23 < (long)uVar24) {
                            uVar24 = 0;
                          }
                          uVar17 = auStack_228[lVar14];
                          alStack_4e8[lVar14] = uVar17;
                          alStack_1e8[lVar14] = (uVar29 - local_268[lVar14]) + uVar17;
                          lVar23 = (local_1a8[lVar14] + uVar17 + lVar23) -
                                   (uVar24 + local_a8[lVar14]);
                        }
                        uVar29 = lVar23 + 1;
                      }
                      else {
                        uVar29 = auStack_228[lVar14];
                        alStack_4e8[lVar14] = uVar29;
                        alStack_1e8[lVar14] = (local_368[lVar14] + uVar29) - local_268[lVar14];
                      }
                    }
                    else {
                      alStack_4e8[lVar14] = 0;
                      alStack_1e8[lVar14] =
                           (alStack_68[lVar14] + local_368[lVar14]) - local_268[lVar14];
                      uVar29 = 0;
                    }
                    alStack_f0[lVar14 + 1] = uVar29;
                    lVar14 = lVar14 + 1;
                  } while (lVar30 != lVar14);
                  uVar3 = GA[lVar1].ndim;
                  uVar29 = (ulong)(short)uVar3;
                  uVar5 = GA[lVar1].distr_type;
                  local_65c = uVar5 - 1;
                  local_5d0 = (ulong)uVar5;
                  if (uVar5 - 1 < 3) {
                    uVar24 = local_600 % GA[lVar1].num_blocks[0];
                    local_6a8[0] = (int)uVar24;
                    if (1 < (short)uVar3) {
                      uVar24 = uVar24 & 0xffffffff;
                      lVar27 = 0;
                      IVar16 = proc;
                      do {
                        IVar16 = (long)((int)IVar16 - (int)uVar24) /
                                 *(long *)((long)GA->dims + lVar27 * 8 + lVar13 + -0x38);
                        uVar24 = (long)(int)IVar16 %
                                 *(long *)((long)GA->dims + lVar27 * 8 + lVar13 + -0x30);
                        local_6a8[lVar27 + 1] = (int)uVar24;
                        lVar27 = lVar27 + 1;
                      } while ((uVar29 & 0xffffffff) - 1 != lVar27);
                    }
                    lVar27 = local_608;
                    if (0 < (short)uVar3) {
                      lVar19 = 0;
                      do {
                        iVar22 = *(int *)((long)local_6a8 + lVar19);
                        lVar13 = *(long *)((long)GA->dims + lVar19 * 2 + lVar27 + -0x30);
                        *(long *)((long)&local_4a8 + lVar19 * 2) = lVar13 * iVar22 + 1;
                        lVar13 = ((long)iVar22 + 1) * lVar13;
                        *(long *)((long)local_648 + lVar19 * 2) = lVar13;
                        lVar14 = *(long *)((long)GA + lVar19 * 2 + lVar27 + -0x1f8);
                        if (lVar14 <= lVar13) {
                          lVar13 = lVar14;
                        }
                        *(long *)((long)local_648 + lVar19 * 2) = lVar13;
                        lVar19 = lVar19 + 4;
                      } while ((uVar29 & 0xffffffff) << 2 != lVar19);
                    }
                  }
                  else if (uVar5 == 4) {
                    uVar24 = local_600 % GA[lVar1].num_blocks[0];
                    local_6a8[0] = (int)uVar24;
                    if (1 < (short)uVar3) {
                      uVar24 = uVar24 & 0xffffffff;
                      lVar27 = 0;
                      IVar16 = proc;
                      do {
                        IVar16 = (long)((int)IVar16 - (int)uVar24) /
                                 *(long *)((long)GA->dims + lVar27 * 8 + lVar13 + -0x38);
                        uVar24 = (long)(int)IVar16 %
                                 *(long *)((long)GA->dims + lVar27 * 8 + lVar13 + -0x30);
                        local_6a8[lVar27 + 1] = (int)uVar24;
                        lVar27 = lVar27 + 1;
                      } while ((uVar29 & 0xffffffff) - 1 != lVar27);
                    }
                    if (0 < (short)uVar3) {
                      pCVar8 = GA[lVar1].mapc;
                      lVar27 = 0;
                      iVar22 = 0;
                      do {
                        iVar11 = *(int *)((long)local_6a8 + lVar27);
                        lVar19 = (long)iVar22 + (long)iVar11;
                        *(C_Integer *)((long)&local_4a8 + lVar27 * 2) = pCVar8[lVar19];
                        if ((long)iVar11 < *(long *)((long)GA[lVar1].num_blocks + lVar27 * 2) + -1)
                        {
                          lVar19 = GA[lVar1].mapc[lVar19 + 1] + -1;
                        }
                        else {
                          lVar19 = *(long *)((long)GA[lVar1].dims + lVar27 * 2);
                        }
                        *(long *)((long)local_648 + lVar27 * 2) = lVar19;
                        iVar22 = iVar22 + *(int *)((long)GA[lVar1].num_blocks + lVar27 * 2);
                        lVar27 = lVar27 + 4;
                      } while ((uVar29 & 0xffffffff) << 2 != lVar27);
                    }
                  }
                  else if (uVar5 == 0) {
                    if (GA[lVar1].num_rstrctd == 0) {
                      if ((short)uVar3 < 1) {
                        lVar27 = 1;
                      }
                      else {
                        lVar27 = 1;
                        uVar24 = 0;
                        do {
                          lVar27 = lVar27 * *(int *)((long)GA->dims + uVar24 * 4 + local_678 + -0x30
                                                    );
                          uVar24 = uVar24 + 1;
                        } while (uVar29 != uVar24);
                      }
                      if ((-1 < proc) && (proc < lVar27)) {
                        if (0 < (short)uVar3) {
                          pCVar8 = GA[lVar1].mapc;
                          lVar27 = 0;
                          uVar24 = 0;
                          IVar16 = proc;
                          do {
                            lVar13 = (long)*(int *)((long)GA[1000].nblock + uVar24 * 4 + local_680);
                            lVar19 = IVar16 % lVar13;
                            (&local_4a8)[uVar24] = pCVar8[lVar19 + lVar27];
                            if (lVar19 == lVar13 + -1) {
                              lVar19 = *(long *)((long)GA[1000].dims + uVar24 * 8 + local_680);
                            }
                            else {
                              lVar19 = pCVar8[lVar19 + lVar27 + 1] + -1;
                            }
                            lVar27 = lVar27 + lVar13;
                            local_648[uVar24] = lVar19;
                            uVar24 = uVar24 + 1;
                            IVar16 = IVar16 / lVar13;
                          } while (uVar29 != uVar24);
                        }
                        goto LAB_0018851f;
                      }
                    }
                    else if (proc < GA[lVar1].num_rstrctd) {
                      if ((short)uVar3 < 1) {
                        lVar27 = 1;
                      }
                      else {
                        lVar27 = 1;
                        uVar24 = 0;
                        do {
                          lVar27 = lVar27 * *(int *)((long)GA->dims + uVar24 * 4 + local_678 + -0x30
                                                    );
                          uVar24 = uVar24 + 1;
                        } while (uVar29 != uVar24);
                      }
                      if ((-1 < proc) && (proc < lVar27)) {
                        if (0 < (short)uVar3) {
                          pCVar8 = GA[lVar1].mapc;
                          lVar27 = 0;
                          uVar24 = 0;
                          IVar16 = proc;
                          do {
                            lVar13 = (long)*(int *)((long)GA[1000].nblock + uVar24 * 4 + local_680);
                            lVar19 = IVar16 % lVar13;
                            (&local_4a8)[uVar24] = pCVar8[lVar19 + lVar27];
                            if (lVar19 == lVar13 + -1) {
                              lVar19 = *(long *)((long)GA[1000].dims + uVar24 * 8 + local_680);
                            }
                            else {
                              lVar19 = pCVar8[lVar19 + lVar27 + 1] + -1;
                            }
                            lVar27 = lVar27 + lVar13;
                            local_648[uVar24] = lVar19;
                            uVar24 = uVar24 + 1;
                            IVar16 = IVar16 / lVar13;
                          } while (uVar29 != uVar24);
                        }
                        goto LAB_0018851f;
                      }
                    }
                    if (0 < (short)uVar3) {
                      memset(&local_4a8,0,uVar29 * 8);
                      memset(local_648,0xff,uVar29 * 8);
                    }
                  }
LAB_0018851f:
                  lVar27 = local_670;
                  if (uVar29 == 1) {
                    local_128[0] = (local_648[0] - local_4a8) + pgVar10[lVar1].width[0] * 2 + 1;
                  }
                  if ((short)uVar3 < 2) {
                    lVar14 = 1;
                    lVar13 = 0;
                  }
                  else {
                    lVar14 = 1;
                    lVar13 = 0;
                    lVar19 = 0;
                    do {
                      lVar13 = lVar13 + alStack_f0[lVar19 + 1] * lVar14;
                      lVar23 = (local_648[lVar19] - (&local_4a8)[lVar19]) +
                               *(long *)((long)pgVar10->dims + lVar19 * 8 + local_5f8 + -0x30) * 2 +
                               1;
                      local_128[lVar19] = lVar23;
                      lVar14 = lVar14 * lVar23;
                      lVar19 = lVar19 + 1;
                    } while (uVar29 - 1 != lVar19);
                  }
                  lVar23 = alStack_f0[uVar29];
                  iVar22 = pgVar10[lVar1].elemsize;
                  local_5c8 = (long)iVar22;
                  local_5c0 = pgVar10[lVar1].ptr;
                  pcVar6 = pgVar10[lVar1].ptr[proc];
                  if (local_65c < 3) {
                    uVar24 = (long)(int)uVar21 % pgVar10[lVar1].num_blocks[0];
                    local_6a8[0] = (int)uVar24;
                    if (1 < (short)uVar3) {
                      uVar24 = uVar24 & 0xffffffff;
                      lVar19 = 0;
                      uVar17 = uVar21;
                      do {
                        uVar17 = (long)((int)uVar17 - (int)uVar24) /
                                 *(long *)((long)pgVar10->dims + lVar19 * 8 + lVar27 + -0x38);
                        uVar24 = (long)(int)uVar17 %
                                 *(long *)((long)pgVar10->dims + lVar19 * 8 + lVar27 + -0x30);
                        local_6a8[lVar19 + 1] = (int)uVar24;
                        lVar19 = lVar19 + 1;
                      } while ((uVar29 & 0xffffffff) - 1 != lVar19);
                    }
                    lVar27 = local_608;
                    if (0 < (short)uVar3) {
                      lVar19 = 0;
                      do {
                        iVar11 = *(int *)((long)local_6a8 + lVar19);
                        lVar25 = *(long *)((long)pgVar10->dims + lVar19 * 2 + lVar27 + -0x30);
                        *(long *)((long)&local_4a8 + lVar19 * 2) = lVar25 * iVar11 + 1;
                        lVar25 = ((long)iVar11 + 1) * lVar25;
                        *(long *)((long)local_648 + lVar19 * 2) = lVar25;
                        lVar28 = *(long *)((long)pgVar10 + lVar19 * 2 + lVar27 + -0x1f8);
                        if (lVar28 <= lVar25) {
                          lVar25 = lVar28;
                        }
                        *(long *)((long)local_648 + lVar19 * 2) = lVar25;
                        lVar19 = lVar19 + 4;
                      } while ((uVar29 & 0xffffffff) << 2 != lVar19);
                    }
                  }
                  else if ((int)local_5d0 == 4) {
                    uVar24 = (long)(int)uVar21 % pgVar10[lVar1].num_blocks[0];
                    local_6a8[0] = (int)uVar24;
                    if (1 < (short)uVar3) {
                      uVar24 = uVar24 & 0xffffffff;
                      lVar19 = 0;
                      uVar17 = uVar21;
                      do {
                        uVar17 = (long)((int)uVar17 - (int)uVar24) /
                                 *(long *)((long)pgVar10->dims + lVar19 * 8 + lVar27 + -0x38);
                        uVar24 = (long)(int)uVar17 %
                                 *(long *)((long)pgVar10->dims + lVar19 * 8 + lVar27 + -0x30);
                        local_6a8[lVar19 + 1] = (int)uVar24;
                        lVar19 = lVar19 + 1;
                      } while ((uVar29 & 0xffffffff) - 1 != lVar19);
                    }
                    if (0 < (short)uVar3) {
                      pCVar8 = pgVar10[lVar1].mapc;
                      lVar27 = 0;
                      iVar11 = 0;
                      do {
                        iVar18 = *(int *)((long)local_6a8 + lVar27);
                        lVar19 = (long)iVar11 + (long)iVar18;
                        *(C_Integer *)((long)&local_4a8 + lVar27 * 2) = pCVar8[lVar19];
                        if ((long)iVar18 <
                            *(long *)((long)pgVar10[lVar1].num_blocks + lVar27 * 2) + -1) {
                          lVar19 = pgVar10[lVar1].mapc[lVar19 + 1] + -1;
                        }
                        else {
                          lVar19 = *(long *)((long)pgVar10[lVar1].dims + lVar27 * 2);
                        }
                        *(long *)((long)local_648 + lVar27 * 2) = lVar19;
                        iVar11 = iVar11 + *(int *)((long)pgVar10[lVar1].num_blocks + lVar27 * 2);
                        lVar27 = lVar27 + 4;
                      } while ((uVar29 & 0xffffffff) << 2 != lVar27);
                    }
                  }
                  else if ((int)local_5d0 == 0) {
                    if (pgVar10[lVar1].num_rstrctd == 0) {
                      if ((short)uVar3 < 1) {
                        lVar27 = 1;
                      }
                      else {
                        lVar27 = 1;
                        uVar24 = 0;
                        do {
                          lVar27 = lVar27 * *(int *)((long)pgVar10->dims +
                                                    uVar24 * 4 + local_678 + -0x30);
                          uVar24 = uVar24 + 1;
                        } while (uVar29 != uVar24);
                      }
                      if (((long)uVar21 < 0) || (lVar27 <= (long)uVar21)) {
LAB_00188960:
                        if (0 < (short)uVar3) {
                          memset(&local_4a8,0,uVar29 << 3);
LAB_0018898f:
                          memset(local_648,0xff,uVar29 << 3);
                        }
                      }
                      else if (0 < (short)uVar3) {
                        pCVar8 = pgVar10[lVar1].mapc;
                        lVar27 = 0;
                        uVar17 = 0;
                        uVar24 = uVar21;
                        do {
                          lVar25 = (long)*(int *)((long)pgVar10[1000].nblock +
                                                 uVar17 * 4 + local_680);
                          lVar19 = (long)uVar24 % lVar25;
                          (&local_4a8)[uVar17] = pCVar8[lVar19 + lVar27];
                          if (lVar19 == lVar25 + -1) {
                            lVar19 = *(long *)((long)pgVar10[1000].dims + uVar17 * 8 + local_680);
                          }
                          else {
                            lVar19 = pCVar8[lVar19 + lVar27 + 1] + -1;
                          }
                          lVar27 = lVar27 + lVar25;
                          local_648[uVar17] = lVar19;
                          uVar17 = uVar17 + 1;
                          uVar24 = (long)uVar24 / lVar25;
                        } while (uVar29 != uVar17);
                      }
                    }
                    else if ((long)uVar21 < pgVar10[lVar1].num_rstrctd) {
                      if ((short)uVar3 < 1) {
                        lVar27 = 1;
                      }
                      else {
                        lVar27 = 1;
                        uVar24 = 0;
                        do {
                          lVar27 = lVar27 * *(int *)((long)pgVar10->dims +
                                                    uVar24 * 4 + local_678 + -0x30);
                          uVar24 = uVar24 + 1;
                        } while (uVar29 != uVar24);
                      }
                      if (((long)uVar21 < 0) || (lVar27 <= (long)uVar21)) goto LAB_00188960;
                      if (0 < (short)uVar3) {
                        pCVar8 = pgVar10[lVar1].mapc;
                        lVar27 = 0;
                        uVar17 = 0;
                        uVar24 = uVar21;
                        do {
                          lVar25 = (long)*(int *)((long)pgVar10[1000].nblock +
                                                 uVar17 * 4 + local_680);
                          lVar19 = (long)uVar24 % lVar25;
                          (&local_4a8)[uVar17] = pCVar8[lVar19 + lVar27];
                          if (lVar19 == lVar25 + -1) {
                            lVar19 = *(long *)((long)pgVar10[1000].dims + uVar17 * 8 + local_680);
                          }
                          else {
                            lVar19 = pCVar8[lVar19 + lVar27 + 1] + -1;
                          }
                          lVar27 = lVar27 + lVar25;
                          local_648[uVar17] = lVar19;
                          uVar17 = uVar17 + 1;
                          uVar24 = (long)uVar24 / lVar25;
                        } while (uVar29 != uVar17);
                      }
                    }
                    else if (0 < (short)uVar3) {
                      memset(&local_4a8,0,(ulong)uVar3 << 3);
                      goto LAB_0018898f;
                    }
                  }
                  g_a = local_590;
                  lVar19 = local_5f0;
                  lVar27 = local_650;
                  if (uVar29 == 1) {
                    local_168[0] = (local_648[0] - local_4a8) + pgVar10[lVar1].width[0] * 2 + 1;
                  }
                  if ((short)uVar3 < 2) {
                    lVar28 = 1;
                    lVar25 = 0;
                  }
                  else {
                    lVar28 = 1;
                    lVar25 = 0;
                    lVar20 = 0;
                    do {
                      lVar25 = lVar25 + alStack_4e8[lVar20] * lVar28;
                      lVar26 = (local_648[lVar20] - (&local_4a8)[lVar20]) +
                               *(long *)((long)pgVar10->dims + lVar20 * 8 + local_5f8 + -0x30) * 2 +
                               1;
                      local_168[lVar20] = lVar26;
                      lVar28 = lVar28 * lVar26;
                      lVar20 = lVar20 + 1;
                    } while (uVar29 - 1 != lVar20);
                  }
                  lVar20 = alStack_4e8[uVar29 - 1];
                  pcVar7 = local_5c0[uVar21];
                  local_568[0] = iVar4;
                  local_588[0] = iVar4;
                  if (sVar2 != 1) {
                    lVar26 = 0;
                    iVar11 = iVar4;
                    iVar18 = iVar4;
                    do {
                      iVar18 = iVar18 * (int)local_168[lVar26];
                      local_588[lVar26] = iVar18;
                      iVar11 = iVar11 * (int)local_128[lVar26];
                      local_568[lVar26] = iVar11;
                      local_588[lVar26 + 1] = iVar18;
                      local_568[lVar26 + 1] = iVar11;
                      lVar26 = lVar26 + 1;
                    } while (local_598 != lVar26);
                  }
                  lVar26 = 0;
                  do {
                    local_508[lVar26] = ((int)alStack_1e8[lVar26] - (int)alStack_4e8[lVar26]) + 1;
                    lVar26 = lVar26 + 1;
                  } while (lVar30 != lVar26);
                  local_508[0] = local_508[0] * iVar4;
                  if (-1 < (int)local_5b0) {
                    uVar21 = (ulong)(uint)PGRP_LIST[local_5b0].inv_map_proc_list[uVar21];
                  }
                  ARMCI_GetS(pcVar7 + (lVar28 * lVar20 + lVar25) * local_5c8,local_588,
                             pcVar6 + (lVar14 * lVar23 + lVar13) * (long)iVar22,local_568,local_508,
                             local_5a4,(int)uVar21);
                  lVar13 = local_5b8 + 1;
                } while (lVar13 < local_668);
              }
              lVar13 = local_5e8 + 1;
            } while (lVar13 != lVar27);
          }
        }
        if (lVar19 < local_5a0) {
          pnga_pgroup_sync(local_5b0);
        }
        if (local_5a8 != 0) {
          alStack_68[lVar19] = local_5d8 * 2;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != lVar30);
    }
    free(local_5e0);
    free(local_658);
  }
  return;
}

Assistant:

void pnga_update1_ghosts(Integer g_a)
{
  Integer idx, ipx, inx, i, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer size, ndim, nwidth, offset, slice, increment[MAXDIM];
  Integer width[MAXDIM];
  Integer dims[MAXDIM], imax=0;
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer lo_rem[MAXDIM], hi_rem[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int corner_flag;
  int stride_loc[MAXDIM], stride_rem[MAXDIM], count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  logical hasData = TRUE;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

 /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. If lo_rem[] and hi_rem[] cross a global
   *        array boundary, as opposed to being entirely located on one
   *       side or the other of the array, then two sets of slo_rem[] and
   *       shi_rem[] will be created. One set will correspond to the
   *       block of data on one side of the global array boundary and the
   *       other set will correspond to the remaining block. This
   *       situation will only occur if the value of the ghost cell width
   *       is greater than the dimension of the visible global array
   *       data on a single processor.
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   *
   * For the case where the width of the ghost cells is more than the
   * width of the visible data held on a processor, special problems
   * arise. It now takes several updates to fill in one block of boundary
   * data and it is now necessary to keep track of where each of these
   * blocks of data go in the ghost cell region. To do this two extra
   * variables are needed. These are offset and slice. Slice is equal to
   * the width of the visible data along the dimension being updated
   * minus one coming from the remote processor. Offset is the amount
   * that this data must be moved inward from the lower boundary of the
   * ghost cell region. Another variable that is also used to handle
   * this case is imax. If this variable is set to 2, then this means
   * that the block of data that is needed to update the ghost cells
   * crosses a global array boundary and the block needs to be broken
   * up into two pieces. */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return;

  _ga_map = malloc((GAnproc*2*MAXDIM +1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update1_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update1_ghosts:malloc failed (_ga_proclist)",0);

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  corner_flag = GA[handle].corner_flag;
  p_handle = GA[handle].p_handle;

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);
  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) hasData = FALSE;
  }

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {
    nwidth = (Integer)width[idx];

    /* Do not bother with update if nwidth is zero or processor has
       no data */
    if (nwidth != 0 && hasData) {

      /* Perform update in negative direction. Start by getting rough
         estimate of block of needed data*/
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rem[i] = lo_loc[i] - nwidth;
          hi_rem[i] = lo_loc[i] - 1;
          /* Check to see if we will need to update ghost cells using
             one or two major patches of the global array. */
          if (lo_rem[i] < 1) {
            if (hi_rem[i] > 0) {
              imax = 2;
            } else {
              imax = 1;
            }
          } else {
            imax = 1;
          }
        } else {
          lo_rem[i] = lo_loc[i];
          hi_rem[i] = hi_loc[i];
        }
      }

      for (inx = 0; inx < imax; inx++) {
        /* Check to see if boundary is being updated in one patch or two,
           adjust lower boundary accordingly. */
        for (i=0; i<ndim; i++) {
          if (imax == 2 && i == idx) {
            if (inx == 0) {
              slo_rem[i] = 1;
              shi_rem[i] = hi_rem[i];
            } else {
              slo_rem[i] = lo_rem[i] + dims[i];
              shi_rem[i] = dims[i];
            }
          } else if (i == idx) {
            if (lo_rem[i] < 1) {
              slo_rem[i] = dims[i] - nwidth + 1;
              shi_rem[i] = dims[i];
            } else {
              slo_rem[i] = lo_rem[i];
              shi_rem[i] = hi_rem[i];
            }
          } else {
            slo_rem[i] = lo_rem[i];
            shi_rem[i] = hi_rem[i];
          }
        }
        /* locate processor with this data */
        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        for (ipx = 0; ipx < np; ipx++) {
          /* Get actual coordinates of desired chunk of remote
             data as well as the actual coordinates of the local chunk
             of data that will receive the remote data (these
             coordinates take into account the presence of ghost
             cells). Start by finding out what data is actually held by
             remote processor. */
          proc_rem = _ga_proclist[ipx];
          pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
          for (i = 0; i < ndim; i++) {
            if (increment[i] == 0) {
              if (i == idx) {
                if (np == 1 && imax == 1) {
                  plo_rem[i] = thi_rem[i] - tlo_rem[i] + 1;
                  phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                  plo_loc[i] = 0;
                  /*phi_loc[i] = width[i] - 1;*/
                } else {
                  if (tlo_rem[i] >= slo_rem[i]) {
                    offset = tlo_rem[i] - lo_rem[i];
                    slice = thi_rem[i] - tlo_rem[i];
                  } else {
                    offset = 0;
                    slice = thi_rem[i] - slo_rem[i];
                  }
                  if (offset < 0) offset = offset + dims[i];
                  if (offset >= dims[i]) offset = offset - dims[i];
                  plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] - slice;
                  phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                  plo_loc[i] = offset;
                  /*phi_loc[i] = offset + slice;*/
                }
              } else {
                plo_rem[i] = width[i];
                phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                plo_loc[i] = width[i];
                /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
              }
            } else {
              plo_rem[i] = 0;
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
              plo_loc[i] = 0;
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
            }
          }

          /* Get pointer to local data buffer and remote data
             buffer as well as lists of leading dimenstions */
          gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
          gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

          /* Evaluate strides on local and remote processors */
          gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
              stride_loc);

          /* Compute the number of elements in each dimension and store
             result in count. Scale the first element in count by the
             element size. */
          gam_ComputeCount(ndim, plo_rem, phi_rem, count);
          count[0] *= size;
 
          /* get remote data */
          if (p_handle >= 0) {
            proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
          }
          ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
              (int)(ndim - 1), (int)proc_rem);
        }
      }

      /* Perform update in positive direction. Start by getting rough
         estimate of block of needed data*/
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rem[i] = hi_loc[i] + 1;
          hi_rem[i] = hi_loc[i] + nwidth;
          /* Check to see if we will need to update ghost cells using
             one or two major patches of the global array. */
          if (hi_rem[i] > dims[i]) {
            if (lo_rem[i] <= dims[i]) {
              imax = 2;
            } else {
              imax = 1;
            }
          } else {
            imax = 1;
          }
        } else {
          lo_rem[i] = lo_loc[i];
          hi_rem[i] = hi_loc[i];
        }
      }

      for (inx = 0; inx < imax; inx++) {
        /* Check to see if boundary is being updated in one patch or two,
           adjust lower boundary accordingly. */
        for (i=0; i<ndim; i++) {
          if (imax == 2 && i == idx) {
            if (inx == 0) {
              slo_rem[i] = lo_rem[i];
              shi_rem[i] = dims[i];
            } else {
              slo_rem[i] = 1;
              shi_rem[i] = hi_rem[i] - dims[i];
            }
          } else if (i == idx) {
            if (hi_rem[i] > dims[i]) {
              slo_rem[i] = 1;
              shi_rem[i] = nwidth;
            } else {
              slo_rem[i] = lo_rem[i];
              shi_rem[i] = hi_rem[i];
            }
          } else {
            slo_rem[i] = lo_rem[i];
            shi_rem[i] = hi_rem[i];
          }
        }
        /* locate processor with this data */
        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        for (ipx = 0; ipx < np; ipx++) {
          /* Get actual coordinates of desired chunk of remote
             data as well as the actual coordinates of the local chunk
             of data that will receive the remote data (these
             coordinates take into account the presence of ghost
             cells). Start by finding out what data is actually held by
             remote processor. */
          proc_rem = _ga_proclist[ipx];
          pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
          for (i = 0; i < ndim; i++) {
            if (increment[i] == 0) {
              if (i == idx) {
                if (np == 1 && imax == 1) {
                  plo_rem[i] = width[i];
                  phi_rem[i] = 2*width[i] - 1;
                  plo_loc[i] = hi_loc[i] - lo_loc[i] + 1 + width[i];
                  /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i];*/
                } else {
                  offset = tlo_rem[i] - hi_loc[i] - 1;
                  if (thi_rem[i] <= shi_rem[i]) {
                    slice = thi_rem[i] - tlo_rem[i];
                  } else {
                    slice = shi_rem[i] - tlo_rem[i];
                  }
                  if (offset < 0) offset = offset + dims[i];
                  if (offset >= dims[i]) offset = offset - dims[i];
                  plo_rem[i] = width[i];
                  phi_rem[i] = width[i] + slice;
                  plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] + 1 + offset;
                  /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i] + 1
                    + offset + slice;*/
                }
              } else {
                plo_rem[i] = width[i];
                phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                plo_loc[i] = width[i];
                /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
              }
            } else {
              plo_rem[i] = 0;
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
              plo_loc[i] = 0;
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
            }
          }

          /* Get pointer to local data buffer and remote data
             buffer as well as lists of leading dimenstions */
          gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
          gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

          /* Evaluate strides on local and remote processors */
          gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
              stride_loc);

          /* Compute the number of elements in each dimension and store
             result in count. Scale the first element in count by the
             element size. */
          gam_ComputeCount(ndim, plo_rem, phi_rem, count);
          count[0] *= size;
 
          /* get remote data */
          if (p_handle >= 0) {
            proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
          }
          ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
              (int)(ndim - 1), (int)proc_rem);
        }
      }
    }
    /* synchronize all processors and update increment array */
    if (idx < ndim-1) pnga_pgroup_sync(p_handle);
    if (corner_flag)
      increment[idx] = 2*nwidth;
  }

  free(_ga_map);
  free(_ga_proclist);
}